

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_avx2.c
# Opt level: O2

uint masked_sad32xh_avx2(uint8_t *src_ptr,int src_stride,uint8_t *a_ptr,int a_stride,uint8_t *b_ptr,
                        int b_stride,uint8_t *m_ptr,int m_stride,int width,int height)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int iVar9;
  long lVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  
  iVar9 = 0;
  if (height < 1) {
    height = 0;
  }
  auVar11 = ZEXT1664((undefined1  [16])0x0);
  auVar12[8] = 0x40;
  auVar12._0_8_ = 0x4040404040404040;
  auVar12[9] = 0x40;
  auVar12[10] = 0x40;
  auVar12[0xb] = 0x40;
  auVar12[0xc] = 0x40;
  auVar12[0xd] = 0x40;
  auVar12[0xe] = 0x40;
  auVar12[0xf] = 0x40;
  auVar12[0x10] = 0x40;
  auVar12[0x11] = 0x40;
  auVar12[0x12] = 0x40;
  auVar12[0x13] = 0x40;
  auVar12[0x14] = 0x40;
  auVar12[0x15] = 0x40;
  auVar12[0x16] = 0x40;
  auVar12[0x17] = 0x40;
  auVar12[0x18] = 0x40;
  auVar12[0x19] = 0x40;
  auVar12[0x1a] = 0x40;
  auVar12[0x1b] = 0x40;
  auVar12[0x1c] = 0x40;
  auVar12[0x1d] = 0x40;
  auVar12[0x1e] = 0x40;
  auVar12[0x1f] = 0x40;
  auVar13._8_2_ = 0x200;
  auVar13._0_8_ = 0x200020002000200;
  auVar13._10_2_ = 0x200;
  auVar13._12_2_ = 0x200;
  auVar13._14_2_ = 0x200;
  auVar13._16_2_ = 0x200;
  auVar13._18_2_ = 0x200;
  auVar13._20_2_ = 0x200;
  auVar13._22_2_ = 0x200;
  auVar13._24_2_ = 0x200;
  auVar13._26_2_ = 0x200;
  auVar13._28_2_ = 0x200;
  auVar13._30_2_ = 0x200;
  for (; iVar9 != height; iVar9 = iVar9 + 1) {
    for (lVar10 = 0; lVar10 < width; lVar10 = lVar10 + 0x20) {
      auVar1 = vlddqu_avx(*(undefined1 (*) [32])(src_ptr + lVar10));
      auVar2 = vlddqu_avx(*(undefined1 (*) [32])(a_ptr + lVar10));
      auVar3 = vlddqu_avx(*(undefined1 (*) [32])(b_ptr + lVar10));
      auVar4 = vlddqu_avx(*(undefined1 (*) [32])(m_ptr + lVar10));
      auVar6 = vpsubb_avx2(auVar12,auVar4);
      auVar7 = vpunpcklbw_avx2(auVar2,auVar3);
      auVar8 = vpunpcklbw_avx2(auVar4,auVar6);
      auVar7 = vpmaddubsw_avx2(auVar7,auVar8);
      auVar7 = vpmulhrsw_avx2(auVar7,auVar13);
      auVar2 = vpunpckhbw_avx2(auVar2,auVar3);
      auVar3 = vpunpckhbw_avx2(auVar4,auVar6);
      auVar2 = vpmaddubsw_avx2(auVar2,auVar3);
      auVar2 = vpmulhrsw_avx2(auVar2,auVar13);
      auVar2 = vpackuswb_avx2(auVar7,auVar2);
      auVar1 = vpsadbw_avx2(auVar2,auVar1);
      auVar1 = vpaddd_avx2(auVar11._0_32_,auVar1);
      auVar11 = ZEXT3264(auVar1);
    }
    src_ptr = src_ptr + src_stride;
    a_ptr = a_ptr + a_stride;
    b_ptr = b_ptr + b_stride;
    m_ptr = m_ptr + m_stride;
  }
  auVar12 = vpshufd_avx2(auVar11._0_32_,0xd8);
  auVar12 = vpermq_avx2(auVar12,0xd8);
  auVar5 = vphaddd_avx(auVar12._0_16_,auVar12._0_16_);
  auVar5 = vphaddd_avx(auVar5,auVar5);
  return auVar5._0_4_;
}

Assistant:

static inline unsigned int masked_sad32xh_avx2(
    const uint8_t *src_ptr, int src_stride, const uint8_t *a_ptr, int a_stride,
    const uint8_t *b_ptr, int b_stride, const uint8_t *m_ptr, int m_stride,
    int width, int height) {
  int x, y;
  __m256i res = _mm256_setzero_si256();
  const __m256i mask_max = _mm256_set1_epi8((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m256i round_scale =
      _mm256_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x += 32) {
      const __m256i src = _mm256_lddqu_si256((const __m256i *)&src_ptr[x]);
      const __m256i a = _mm256_lddqu_si256((const __m256i *)&a_ptr[x]);
      const __m256i b = _mm256_lddqu_si256((const __m256i *)&b_ptr[x]);
      const __m256i m = _mm256_lddqu_si256((const __m256i *)&m_ptr[x]);
      const __m256i m_inv = _mm256_sub_epi8(mask_max, m);

      // Calculate 16 predicted pixels.
      // Note that the maximum value of any entry of 'pred_l' or 'pred_r'
      // is 64 * 255, so we have plenty of space to add rounding constants.
      const __m256i data_l = _mm256_unpacklo_epi8(a, b);
      const __m256i mask_l = _mm256_unpacklo_epi8(m, m_inv);
      __m256i pred_l = _mm256_maddubs_epi16(data_l, mask_l);
      pred_l = _mm256_mulhrs_epi16(pred_l, round_scale);

      const __m256i data_r = _mm256_unpackhi_epi8(a, b);
      const __m256i mask_r = _mm256_unpackhi_epi8(m, m_inv);
      __m256i pred_r = _mm256_maddubs_epi16(data_r, mask_r);
      pred_r = _mm256_mulhrs_epi16(pred_r, round_scale);

      const __m256i pred = _mm256_packus_epi16(pred_l, pred_r);
      res = _mm256_add_epi32(res, _mm256_sad_epu8(pred, src));
    }

    src_ptr += src_stride;
    a_ptr += a_stride;
    b_ptr += b_stride;
    m_ptr += m_stride;
  }
  // At this point, we have two 32-bit partial SADs in lanes 0 and 2 of 'res'.
  res = _mm256_shuffle_epi32(res, 0xd8);
  res = _mm256_permute4x64_epi64(res, 0xd8);
  res = _mm256_hadd_epi32(res, res);
  res = _mm256_hadd_epi32(res, res);
  int32_t sad = _mm256_extract_epi32(res, 0);
  return sad;
}